

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::CumulativeReporterBase<Catch::JunitReporter>::sectionStarting
          (CumulativeReporterBase<Catch::JunitReporter> *this,SectionInfo *sectionInfo)

{
  bool bVar1;
  SectionInfo *in_RSI;
  __normal_iterator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_*,_std::vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>
  in_RDI;
  __normal_iterator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_*,_std::vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>
  it;
  SectionNode *parentNode;
  shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode> node;
  SectionStats incompleteStats;
  vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
  *in_stack_fffffffffffffeb8;
  __shared_ptr_access<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_fffffffffffffec0;
  value_type *in_stack_fffffffffffffec8;
  __normal_iterator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_*,_std::vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>
  in_stack_fffffffffffffed0;
  __normal_iterator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_*,_std::vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>
  in_stack_fffffffffffffee8;
  BySectionInfo local_100;
  shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode> *local_f8;
  shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode> *local_f0;
  __normal_iterator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_*,_std::vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>
  local_e8;
  element_type *local_e0;
  value_type local_b8;
  Counts local_a8 [6];
  SectionInfo *local_10;
  
  local_10 = in_RSI;
  memset(local_a8,0,0x18);
  Counts::Counts(local_a8);
  SectionStats::SectionStats
            ((SectionStats *)in_RDI._M_current,in_RSI,(Counts *)in_stack_fffffffffffffed0._M_current
             ,(double)in_stack_fffffffffffffec8,SUB81((ulong)in_stack_fffffffffffffec0 >> 0x38,0));
  clara::std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>::
  shared_ptr((shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode> *)
             0x2bb31e);
  bVar1 = clara::std::
          vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
          ::empty((vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
                   *)in_stack_fffffffffffffed0._M_current);
  if (bVar1) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool
                      ((__shared_ptr *)
                       (((SectionStats *)((long)in_RDI._M_current + 0x80))->sectionInfo).name.
                       field_2._M_local_buf);
    if (!bVar1) {
      std::
      make_shared<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode,Catch::SectionStats&>
                ((SectionStats *)in_stack_fffffffffffffee8._M_current);
      clara::std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>::
      operator=((shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode> *)
                in_stack_fffffffffffffec0,
                (shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode> *)
                in_stack_fffffffffffffeb8);
      clara::std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>::
      ~shared_ptr((shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode> *)
                  0x2bb38a);
    }
    clara::std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>::
    operator=((shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode> *)
              in_stack_fffffffffffffec0,
              (shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode> *)
              in_stack_fffffffffffffeb8);
  }
  else {
    clara::std::
    vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
    ::back((vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
            *)in_stack_fffffffffffffec0);
    local_e0 = clara::std::
               __shared_ptr_access<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*(in_stack_fffffffffffffec0);
    local_f0 = (shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode> *)
               clara::std::
               vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
               ::begin(in_stack_fffffffffffffeb8);
    local_f8 = (shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode> *)
               clara::std::
               vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
               ::end(in_stack_fffffffffffffeb8);
    BySectionInfo::BySectionInfo(&local_100,local_10);
    in_stack_fffffffffffffed0 =
         std::
         find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>*,std::vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>>>>,Catch::CumulativeReporterBase<Catch::JunitReporter>::BySectionInfo>
                   (in_stack_fffffffffffffee8,in_RDI,(BySectionInfo *)in_RSI);
    local_e8 = in_stack_fffffffffffffed0;
    clara::std::
    vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
    ::end(in_stack_fffffffffffffeb8);
    bVar1 = __gnu_cxx::operator==
                      ((__normal_iterator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_*,_std::vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>
                        *)in_stack_fffffffffffffec0,
                       (__normal_iterator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_*,_std::vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>
                        *)in_stack_fffffffffffffeb8);
    if (bVar1) {
      std::
      make_shared<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode,Catch::SectionStats&>
                ((SectionStats *)in_stack_fffffffffffffee8._M_current);
      in_stack_fffffffffffffec8 = &local_b8;
      in_stack_fffffffffffffec0 =
           (__shared_ptr_access<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            *)&stack0xfffffffffffffee8;
      clara::std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>::
      operator=((shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode> *)
                in_stack_fffffffffffffec0,
                (shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode> *)
                in_stack_fffffffffffffeb8);
      clara::std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>::
      ~shared_ptr((shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode> *)
                  0x2bb4bf);
      clara::std::
      vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
      ::push_back((vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
                   *)in_stack_fffffffffffffed0._M_current,in_stack_fffffffffffffec8);
    }
    else {
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_*,_std::vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>
      ::operator*(&local_e8);
      clara::std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>::
      operator=((shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode> *)
                in_stack_fffffffffffffec0,
                (shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode> *)
                in_stack_fffffffffffffeb8);
    }
  }
  clara::std::
  vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
  ::push_back((vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
               *)in_stack_fffffffffffffed0._M_current,in_stack_fffffffffffffec8);
  clara::std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>::
  operator=((shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode> *)
            in_stack_fffffffffffffec0,
            (shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode> *)
            in_stack_fffffffffffffeb8);
  clara::std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>::
  ~shared_ptr((shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode> *)
              0x2bb536);
  SectionStats::~SectionStats((SectionStats *)0x2bb543);
  return;
}

Assistant:

void sectionStarting( SectionInfo const& sectionInfo ) override {
            SectionStats incompleteStats( sectionInfo, Counts(), 0, false );
            std::shared_ptr<SectionNode> node;
            if( m_sectionStack.empty() ) {
                if( !m_rootSection )
                    m_rootSection = std::make_shared<SectionNode>( incompleteStats );
                node = m_rootSection;
            }
            else {
                SectionNode& parentNode = *m_sectionStack.back();
                auto it =
                    std::find_if(   parentNode.childSections.begin(),
                                    parentNode.childSections.end(),
                                    BySectionInfo( sectionInfo ) );
                if( it == parentNode.childSections.end() ) {
                    node = std::make_shared<SectionNode>( incompleteStats );
                    parentNode.childSections.push_back( node );
                }
                else
                    node = *it;
            }
            m_sectionStack.push_back( node );
            m_deepestSection = std::move(node);
        }